

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *p;
  undefined1 *puVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  char *pcVar12;
  undefined1 *puVar13;
  char *pcVar14;
  long in_FS_OFFSET;
  u64 iVal;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *paOut = (char *)0x0;
  *pnOut = 0;
  iVar4 = sqlite3_initialize();
  iVar5 = 7;
  if (iVar4 == 0) {
    p = (char *)sqlite3Malloc((long)n1 + (long)n2 + 0x11);
    if (p != (char *)0x0) {
      local_58 = p;
      if (n1 < 1) {
        pcVar14 = (char *)0x0;
        puVar13 = (undefined1 *)0x0;
      }
      else {
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        iVar4 = sqlite3Fts3GetVarintU(a1,(sqlite_uint64 *)&local_40);
        pcVar14 = a1 + iVar4;
        puVar13 = local_40;
      }
      local_48 = pcVar14;
      if (n2 < 1) {
        pcVar12 = (char *)0x0;
        puVar10 = (undefined1 *)0x0;
      }
      else {
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        iVar4 = sqlite3Fts3GetVarintU(a2,(sqlite_uint64 *)&local_40);
        pcVar12 = a2 + iVar4;
        puVar10 = local_40;
      }
      pcVar8 = p;
      local_50 = pcVar12;
      if (pcVar14 != (char *)0x0 || pcVar12 != (char *)0x0) {
        bVar1 = true;
        puVar6 = (undefined1 *)0x0;
        do {
          iVar4 = -(uint)(puVar13 != puVar10);
          if ((long)puVar10 < (long)puVar13) {
            iVar4 = 1;
          }
          iVar5 = -iVar4;
          if (bDescDoclist == 0) {
            iVar5 = iVar4;
          }
          if (((pcVar14 == (char *)0x0) || (pcVar12 == (char *)0x0)) || (iVar5 != 0)) {
            if ((pcVar12 == (char *)0x0) || (pcVar14 != (char *)0x0 && iVar5 < 0)) {
              uVar7 = (long)puVar6 - (long)puVar13;
              if (bDescDoclist == 0 || bVar1) {
                uVar7 = (long)puVar13 - (long)puVar6;
              }
              lVar3 = 0;
              do {
                lVar9 = lVar3;
                bVar2 = (byte)uVar7;
                local_58[lVar9] = bVar2 | 0x80;
                bVar1 = 0x7f < uVar7;
                lVar3 = lVar9 + 1;
                uVar7 = uVar7 >> 7;
              } while (bVar1);
              local_58[lVar9] = bVar2;
              local_58 = local_58 + lVar9 + 1;
              fts3PoslistCopy(&local_58,&local_48);
              pcVar8 = local_48;
              if (local_48 < a1 + n1) {
                local_40 = &DAT_aaaaaaaaaaaaaaaa;
                iVar4 = sqlite3Fts3GetVarintU(local_48,(sqlite_uint64 *)&local_40);
                puVar11 = (undefined1 *)-(long)local_40;
                if (bDescDoclist == 0) {
                  puVar11 = local_40;
                }
                puVar6 = puVar13;
                pcVar14 = pcVar8 + iVar4;
                puVar13 = puVar11 + (long)puVar13;
                local_48 = pcVar8 + iVar4;
              }
              else {
                local_48 = (char *)0x0;
                puVar6 = puVar13;
                pcVar14 = local_48;
              }
            }
            else {
              uVar7 = (long)puVar6 - (long)puVar10;
              if ((bool)(bDescDoclist == 0 | bVar1)) {
                uVar7 = (long)puVar10 - (long)puVar6;
              }
              lVar3 = 0;
              do {
                lVar9 = lVar3;
                bVar2 = (byte)uVar7;
                local_58[lVar9] = bVar2 | 0x80;
                bVar1 = 0x7f < uVar7;
                lVar3 = lVar9 + 1;
                uVar7 = uVar7 >> 7;
              } while (bVar1);
              local_58[lVar9] = bVar2;
              local_58 = local_58 + lVar9 + 1;
              fts3PoslistCopy(&local_58,&local_50);
              pcVar12 = local_50;
              puVar6 = puVar10;
              if (local_50 < a2 + n2) {
                local_40 = &DAT_aaaaaaaaaaaaaaaa;
                iVar4 = sqlite3Fts3GetVarintU(local_50,(sqlite_uint64 *)&local_40);
                pcVar12 = pcVar12 + iVar4;
                puVar11 = (undefined1 *)-(long)local_40;
                if (bDescDoclist == 0) {
                  puVar11 = local_40;
                }
                puVar10 = puVar11 + (long)puVar10;
                local_50 = pcVar12;
              }
              else {
                local_50 = (char *)0x0;
                pcVar12 = (char *)0x0;
              }
            }
          }
          else {
            uVar7 = (long)puVar6 - (long)puVar13;
            if (bVar1) {
              uVar7 = (long)puVar13 - (long)puVar6;
            }
            if (bDescDoclist == 0) {
              uVar7 = (long)puVar13 - (long)puVar6;
            }
            lVar3 = 0;
            do {
              lVar9 = lVar3;
              bVar2 = (byte)uVar7;
              local_58[lVar9] = bVar2 | 0x80;
              bVar1 = 0x7f < uVar7;
              lVar3 = lVar9 + 1;
              uVar7 = uVar7 >> 7;
            } while (bVar1);
            local_58[lVar9] = bVar2;
            local_58 = local_58 + lVar9 + 1;
            iVar5 = fts3PoslistMerge(&local_58,&local_48,&local_50);
            pcVar14 = local_48;
            if (iVar5 != 0) {
              sqlite3_free(p);
              pcVar8 = (char *)0x0;
              p = (char *)0x0;
              goto LAB_001cbc03;
            }
            if (local_48 < a1 + n1) {
              local_40 = &DAT_aaaaaaaaaaaaaaaa;
              iVar4 = sqlite3Fts3GetVarintU(local_48,(sqlite_uint64 *)&local_40);
              pcVar14 = pcVar14 + iVar4;
              puVar6 = (undefined1 *)-(long)local_40;
              if (bDescDoclist == 0) {
                puVar6 = local_40;
              }
              puVar11 = puVar6 + (long)puVar13;
            }
            else {
              pcVar14 = (char *)0x0;
              puVar11 = puVar13;
            }
            pcVar12 = local_50;
            local_48 = pcVar14;
            if (local_50 < a2 + n2) {
              local_40 = &DAT_aaaaaaaaaaaaaaaa;
              iVar4 = sqlite3Fts3GetVarintU(local_50,(sqlite_uint64 *)&local_40);
              pcVar12 = pcVar12 + iVar4;
              puVar6 = (undefined1 *)-(long)local_40;
              if (bDescDoclist == 0) {
                puVar6 = local_40;
              }
              puVar10 = puVar6 + (long)puVar10;
              puVar6 = puVar13;
              puVar13 = puVar11;
              local_50 = pcVar12;
            }
            else {
              local_50 = (char *)0x0;
              pcVar12 = (char *)0x0;
              puVar6 = puVar13;
              puVar13 = puVar11;
            }
          }
          bVar1 = false;
          pcVar8 = local_58;
        } while (pcVar14 != (char *)0x0 || pcVar12 != (char *)0x0);
      }
      pcVar8[0] = '\0';
      pcVar8[1] = '\0';
      pcVar8[2] = '\0';
      pcVar8[3] = '\0';
      pcVar8[4] = '\0';
      pcVar8[5] = '\0';
      pcVar8[6] = '\0';
      pcVar8[7] = '\0';
      iVar5 = 0;
LAB_001cbc03:
      *paOut = p;
      *pnOut = (int)pcVar8 - (int)p;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow.
  **
  ** A symetric argument may be made if the doclists are in descending
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }

    assert( (p-aOut)<=((p1?(p1-a1):n1)+(p2?(p2-a2):n2)+FTS3_VARINT_MAX-1) );
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}